

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_char,_1l>>(database_writer_policy *this,span<unsigned_char,__1L> sp)

{
  transaction_base *this_00;
  value_type vVar1;
  type num;
  typed_address<unsigned_char> addr;
  shared_ptr<unsigned_char> ptr;
  value_type local_a0;
  uchar *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  index_type local_80;
  pointer local_78;
  index_type local_70;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_68;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  value_type *local_30;
  uchar **local_28;
  
  local_78 = sp.storage_.data_;
  local_80 = (index_type)sp.storage_.super_extent_type<_1L>.size_;
  local_a0 = 0;
  local_98 = (uchar *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = this->transaction_;
  local_70 = local_80;
  num = unsigned_cast<long>(&local_70);
  transaction_base::alloc_rw<unsigned_char,void>(&local_68,this_00,num);
  local_30 = &local_a0;
  local_28 = &local_98;
  std::tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&>::operator=
            ((tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&> *)
             &local_30,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_40);
  gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&local_50);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,unsigned_char*>
            (&local_40,&local_50,local_98);
  vVar1 = local_a0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_90);
  return (result_type)vVar1;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }